

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ising_model.cc
# Opt level: O3

void wolff_main<trng::mrg5>(mrg5 *R,long runs,long split,long L)

{
  ulong uVar1;
  pointer pdVar2;
  char *__s;
  size_t sVar3;
  ostream *poVar4;
  long lVar5;
  int j;
  value_type_conflict2 *__val;
  long lVar6;
  double dVar7;
  lattice s;
  char local_c9;
  double local_c8;
  double local_c0;
  pointer local_b8;
  double local_b0;
  long local_a8;
  double local_a0;
  double local_98;
  double local_90;
  double local_88;
  lattice local_80;
  vector<double,_std::allocator<double>_> local_60;
  vector<double,_std::allocator<double>_> local_48;
  
  uVar1 = L - 8U >> 2;
  local_c8 = (double)L;
  if (0xe < (L << 0x3e | uVar1)) {
    std::operator<<((ostream *)&std::cerr,"invalid lattice size, try 8, 12, ..., 64\n");
    exit(1);
  }
  local_98 = *(double *)(&DAT_0011e668 + uVar1 * 8);
  local_a0 = *(double *)(&DAT_0011e6e0 + uVar1 * 8);
  local_b8 = (pointer)operator_new(0x60);
  local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = local_b8 + 0xc;
  *local_b8 = 0.0;
  local_b8[1] = 0.0;
  local_b8[2] = 0.0;
  local_b8[3] = 0.0;
  local_b8[4] = 0.0;
  local_b8[5] = 0.0;
  local_b8[6] = 0.0;
  local_b8[7] = 0.0;
  local_b8[8] = 0.0;
  local_b8[9] = 0.0;
  local_b8[10] = 0.0;
  local_b8[0xb] = 0.0;
  local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = local_b8;
  local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  pdVar2 = (pointer)operator_new(0x60);
  local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = pdVar2 + 0xc;
  pdVar2[10] = 0.0;
  pdVar2[0xb] = 0.0;
  pdVar2[8] = 0.0;
  pdVar2[9] = 0.0;
  pdVar2[6] = 0.0;
  pdVar2[7] = 0.0;
  pdVar2[4] = 0.0;
  pdVar2[5] = 0.0;
  pdVar2[2] = 0.0;
  pdVar2[3] = 0.0;
  *pdVar2 = 0.0;
  pdVar2[1] = 0.0;
  lVar5 = std::cout;
  *(uint *)(std::__cxx11::string::_M_replace + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::__cxx11::string::_M_replace + *(long *)(std::cout + -0x18)) | 4;
  *(uint *)(std::__cxx11::string::_M_replace + *(long *)(lVar5 + -0x18)) =
       *(uint *)(std::__cxx11::string::_M_replace + *(long *)(lVar5 + -0x18)) | 0x400;
  local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = pdVar2;
  local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  local_c0 = log1p(1.4142135623730951);
  lattice::lattice(&local_80,SUB84(local_c8,0));
  if (0 < local_80.L2) {
    lVar5 = 0;
    do {
      local_80.s.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar5] = -1;
      lVar5 = lVar5 + 1;
    } while (lVar5 < local_80.L2);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Generator : ",0xc);
  __s = trng::mrg5::name();
  if (__s == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x365118);
  }
  else {
    sVar3 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar3);
  }
  local_c9 = '\n';
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,&local_c9,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"Splitting level : ",0x12);
  poVar4 = std::ostream::_M_insert<long>((long)poVar4);
  local_c9 = '\n';
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_c9,1);
  local_c9 = '\n';
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_c9,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"T = ",4);
  local_b0 = 2.0 / local_c0;
  poVar4 = std::ostream::_M_insert<double>(local_b0);
  local_c9 = '\n';
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_c9,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"Lattice = ",10);
  poVar4 = std::ostream::_M_insert<long>((long)poVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"x",1);
  poVar4 = std::ostream::_M_insert<long>((long)poVar4);
  local_c9 = '\n';
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_c9,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"Samples = ",10);
  poVar4 = std::ostream::_M_insert<long>((long)poVar4);
  local_c9 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_c9,1);
  if (0 < runs) {
    lVar5 = 1;
    if (1 < runs * 2) {
      lVar5 = runs * 2;
    }
    do {
      wolffstep<trng::mrg5>(R,&local_80,local_b0);
      lVar5 = lVar5 + -1;
    } while (lVar5 != 0);
  }
  local_a8 = std::chrono::_V2::system_clock::now();
  local_88 = (double)runs;
  local_90 = (double)((long)local_c8 * (long)local_c8) / (local_b0 * local_b0);
  lVar5 = 0;
  do {
    if (runs < 1) {
      local_c0 = 0.0;
      local_c8 = 0.0;
    }
    else {
      local_c8 = 0.0;
      local_c0 = 0.0;
      lVar6 = runs;
      do {
        wolffstep<trng::mrg5>(R,&local_80,local_b0);
        dVar7 = lattice::energy(&local_80);
        local_c0 = local_c0 + dVar7;
        local_c8 = local_c8 + dVar7 * dVar7;
        lVar6 = lVar6 + -1;
      } while (lVar6 != 0);
    }
    dVar7 = local_c0 / local_88;
    local_b8[lVar5] = dVar7;
    pdVar2[lVar5] = (local_c8 / local_88 - dVar7 * dVar7) * local_90;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 10);
  output(&local_48,&local_60,10,local_a0,local_98);
  local_c9 = '\n';
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,&local_c9,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"Time: ",6);
  lVar5 = std::chrono::_V2::system_clock::now();
  poVar4 = std::ostream::_M_insert<double>((double)((lVar5 - local_a8) / 1000) * 1e-06);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," sec.",5);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  if (local_80.s.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_80.s.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  operator_delete(pdVar2);
  operator_delete(local_b8);
  return;
}

Assistant:

void wolff_main(RNG_type &R, long runs, long split, long L) {
  double E_exact, c_exact;
  switch (L) {
    case 8:
      E_exact = -1.4915891074397066;
      c_exact = 1.1455592398944086;
      break;
    case 12:
      E_exact = -1.4659608164862789;
      c_exact = 1.3529506829072697;
      break;
    case 16:
      E_exact = -1.4530648528134771;
      c_exact = 1.4987049594000261;
      break;
    case 20:
      E_exact = -1.4453094678058525;
      c_exact = 1.6111614949041113;
      break;
    case 24:
      E_exact = -1.4401334960573388;
      c_exact = 1.7027336877232671;
      break;
    case 28:
      E_exact = -1.4364340850836483;
      c_exact = 1.7799744882644384;
      break;
    case 32:
      E_exact = -1.4336584661462483;
      c_exact = 1.8467675900395589;
      break;
    case 36:
      E_exact = -1.4314991053179871;
      c_exact = 1.9056050418011437;
      break;
    case 40:
      E_exact = -1.4297713123073425;
      c_exact = 1.9581816502509387;
      break;
    case 44:
      E_exact = -1.4283574829971357;
      c_exact = 2.0057024700476327;
      break;
    case 48:
      E_exact = -1.4271791793855239;
      c_exact = 2.0490550151069595;
      break;
    case 52:
      E_exact = -1.4261820801536625;
      c_exact = 2.0889118621693695;
      break;
    case 56:
      E_exact = -1.4253273745116323;
      c_exact = 2.1257948956620735;
      break;
    case 60:
      E_exact = -1.4245865955789106;
      c_exact = 2.1601172105639529;
      break;
    case 64:
      E_exact = -1.4239383898330109;
      c_exact = 2.1922113931405711;
      break;
    default:
      std::cerr << "invalid lattice size, try 8, 12, ..., 64\n";
      std::exit(EXIT_FAILURE);
  }

  // const double
  const int simulations{10};
  std::vector<double> Ea(simulations + 2);
  std::vector<double> ca(simulations + 2);

  std::cout.setf(std::ios::fixed);
  std::cout.setf(std::ios::showpoint);
  const double T{2.0 / std::log1p(std::sqrt(2.0))};
  lattice s(L);
  s.fill(-1);
  std::cout << "Generator : " << R.name() << '\n'
            << "Splitting level : " << split << '\n'
            << '\n'
            << "T = " << T << '\n'
            << "Lattice = " << L << "x" << L << '\n'
            << "Samples = " << runs << '\n';

  for (int i{0}; i < 2 * runs; ++i)
    wolffstep(R, s, T);
  timer t;
  for (int j{0}; j < simulations; ++j) {
    double E{0.0};
    double E2{0.0};
    for (int i{0}; i < runs; ++i) {
      wolffstep(R, s, T);
      const double q{s.energy()};
      E += q;
      E2 += q * q;
    }
    E /= runs;
    E2 /= runs;
    double c = (L * L) / (T * T) * (E2 - E * E);
    Ea[j] = E;
    ca[j] = c;
  }
  output(Ea, ca, simulations, E_exact, c_exact);
  std::cout << '\n' << "Time: " << t.time() << " sec." << std::endl;
}